

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Stress::anon_unknown_0::BlendingCase::testFBO(BlendingCase *this)

{
  allocator<unsigned_short> *this_00;
  GLenum GVar1;
  GLenum GVar2;
  code *pcVar3;
  short sVar4;
  short sVar5;
  float fVar6;
  GLuint GVar7;
  undefined4 uVar8;
  bool bVar9;
  int iVar10;
  deUint32 dVar11;
  uint uVar12;
  uint x_;
  uint y_;
  reference pvVar13;
  reference pvVar14;
  RenderContext *pRVar15;
  undefined4 extraout_var;
  TestLog *pTVar16;
  MessageBuilder *pMVar17;
  size_type sVar18;
  uint *puVar19;
  ConstPixelBufferAccess local_c68;
  allocator<char> local_c39;
  string local_c38;
  allocator<char> local_c11;
  string local_c10;
  LogImage local_bf0;
  ConstPixelBufferAccess local_b60;
  allocator<char> local_b31;
  string local_b30;
  allocator<char> local_b09;
  string local_b08;
  LogImage local_ae8;
  allocator<char> local_a51;
  string local_a50;
  allocator<char> local_a29;
  string local_a28;
  LogImageSet local_a08;
  MessageBuilder local_9c8;
  deUint32 local_848;
  int local_844;
  PixelBufferAccess local_840;
  undefined1 local_818 [8];
  Vec4 cAfter;
  undefined1 local_7e0 [8];
  Vec4 cBefore;
  int x_3;
  int y_3;
  int local_644;
  RGBA local_640;
  int badPixels;
  RGBA okPixelColor;
  RGBA badPixelColor;
  Surface errorMask;
  MessageBuilder local_5f8;
  undefined1 local_478 [8];
  UVec4 uniformValue;
  deUint32 componentA;
  deUint32 componentB;
  deUint32 componentG;
  deUint32 componentR;
  int indexIndex;
  GLenum blendFunctionDst;
  GLenum blendFunction;
  GLenum blendEquation;
  int y_2;
  int x_2;
  undefined1 local_2bc [8];
  Random rnd;
  int passNdx;
  MessageBuilder local_280;
  GLuint local_100;
  undefined4 local_fc;
  GLint specialLoc;
  GLint positionLoc;
  Functions *gl;
  int numPasses;
  int baseNdx;
  int y_1;
  int x_1;
  float local_d8 [2];
  float local_d0;
  float local_cc;
  float posY;
  float posX;
  int y;
  int x;
  TextureLevel afterImage;
  TextureLevel beforeImage;
  TextureFormat textureFormat;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  allocator<tcu::Vector<float,_4>_> local_31;
  undefined1 local_30 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridVertices;
  int numBlendFuncs;
  BlendingCase *this_local;
  
  gridVertices.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x12;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_31);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30,
             0x1b5,&local_31);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_31);
  this_00 = (allocator<unsigned_short> *)((long)&textureFormat.order + 3);
  std::allocator<unsigned_short>::allocator(this_00);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&textureFormat.type,0x948,
             this_00);
  std::allocator<unsigned_short>::~allocator
            ((allocator<unsigned_short> *)((long)&textureFormat.order + 3));
  tcu::TextureFormat::TextureFormat
            ((TextureFormat *)((long)&beforeImage.m_data.m_cap + 4),RGBA,
             (uint)(*(int *)&(this->super_FramebufferRenderCase).super_RenderCase.field_0x84 == 5)
             << 5 | UNORM_INT8);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&afterImage.m_data.m_cap,
             (TextureFormat *)((long)&beforeImage.m_data.m_cap + 4),0x100,0x100,1);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&y,(TextureFormat *)((long)&beforeImage.m_data.m_cap + 4),0x100,0x100,1
            );
  for (posX = 0.0; (int)posX < 0x17; posX = (float)((int)posX + 1)) {
    for (posY = 0.0; (int)posY < 0x13; posY = (float)((int)posY + 1)) {
      local_cc = (float)(int)posX / 22.0 + (float)(int)posX / 22.0 + -1.0;
      local_d0 = (float)(int)posY / 18.0 + (float)(int)posY / 18.0 + -1.0;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&y_1,local_cc,local_d0,0.0,1.0);
      pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *
                           )local_30,(long)((int)posX * 0x13 + (int)posY));
      *(undefined8 *)pvVar13->m_data = _y_1;
      *(float (*) [2])(pvVar13->m_data + 2) = local_d8;
    }
  }
  for (baseNdx = 0; baseNdx < 0x16; baseNdx = baseNdx + 1) {
    for (numPasses = 0; numPasses < 0x12; numPasses = numPasses + 1) {
      gl._4_4_ = (baseNdx * 0x12 + numPasses) * 6;
      sVar5 = (short)baseNdx;
      sVar4 = (short)numPasses;
      pvVar14 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                           &textureFormat.type,(long)gl._4_4_);
      *pvVar14 = sVar5 * 0x13 + sVar4;
      sVar5 = (short)baseNdx;
      sVar4 = (short)numPasses;
      pvVar14 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                           &textureFormat.type,(long)(gl._4_4_ + 1));
      *pvVar14 = (sVar5 + 1) * 0x13 + sVar4 + 1;
      sVar5 = (short)baseNdx;
      sVar4 = (short)numPasses;
      pvVar14 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                           &textureFormat.type,(long)(gl._4_4_ + 2));
      *pvVar14 = (sVar5 + 1) * 0x13 + sVar4;
      sVar5 = (short)baseNdx;
      sVar4 = (short)numPasses;
      pvVar14 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                           &textureFormat.type,(long)(gl._4_4_ + 3));
      *pvVar14 = sVar5 * 0x13 + sVar4;
      sVar5 = (short)baseNdx;
      sVar4 = (short)numPasses;
      pvVar14 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                           &textureFormat.type,(long)(gl._4_4_ + 4));
      *pvVar14 = (sVar5 + 1) * 0x13 + sVar4 + 1;
      sVar4 = (short)baseNdx;
      sVar5 = (short)numPasses;
      pvVar14 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                           &textureFormat.type,(long)(gl._4_4_ + 5));
      *pvVar14 = sVar4 * 0x13 + sVar5 + 1;
    }
  }
  gl._0_4_ = 5;
  pRVar15 = Context::getRenderContext
                      ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context
                      );
  iVar10 = (*pRVar15->_vptr_RenderContext[3])();
  _specialLoc = CONCAT44(extraout_var,iVar10);
  pcVar3 = *(code **)(_specialLoc + 0x780);
  dVar11 = glu::ShaderProgram::getProgram
                     ((this->super_FramebufferRenderCase).super_RenderCase.m_program);
  local_fc = (*pcVar3)(dVar11,"a_pos");
  pcVar3 = *(code **)(_specialLoc + 0xb48);
  dVar11 = glu::ShaderProgram::getProgram
                     ((this->super_FramebufferRenderCase).super_RenderCase.m_program);
  local_100 = (*pcVar3)(dVar11,"u_special");
  (**(code **)(_specialLoc + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(_specialLoc + 0x188))(0x4000);
  (**(code **)(_specialLoc + 0x1a00))(0,0,0x100);
  pcVar3 = *(code **)(_specialLoc + 0x1680);
  dVar11 = glu::ShaderProgram::getProgram
                     ((this->super_FramebufferRenderCase).super_RenderCase.m_program);
  (*pcVar3)(dVar11);
  (**(code **)(_specialLoc + 0x5e0))(0xbe2);
  dVar11 = (**(code **)(_specialLoc + 0x800))();
  glu::checkError(dVar11,"pre-draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x613);
  uVar8 = local_fc;
  pcVar3 = *(code **)(_specialLoc + 0x19f0);
  pvVar13 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_30,0);
  (*pcVar3)(uVar8,4,0x1406,0,0,pvVar13);
  (**(code **)(_specialLoc + 0x610))(local_fc);
  pTVar16 = tcu::TestContext::getLog
                      ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.
                       super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_280,pTVar16,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar17 = tcu::MessageBuilder::operator<<(&local_280,(char (*) [26])"Drawing pre-draw pattern.");
  tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_280);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&rnd.m_rnd.w,(TextureLevel *)&afterImage.m_data.m_cap);
  GVar7 = local_100;
  sVar18 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_30);
  drawTestImage(this,(PixelBufferAccess *)&rnd.m_rnd.w,GVar7,(int)sVar18 + -1);
  dVar11 = (**(code **)(_specialLoc + 0x800))();
  glu::checkError(dVar11,"pre-draw pattern",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x61b);
  (**(code **)(_specialLoc + 0x188))(0x4000);
  for (rnd.m_rnd.z = 0; (int)rnd.m_rnd.z < 5; rnd.m_rnd.z = rnd.m_rnd.z + 1) {
    de::Random::Random((Random *)local_2bc,rnd.m_rnd.z * 0x237 + 0x7b);
    pTVar16 = tcu::TestContext::getLog
                        ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.
                         super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&y_2,pTVar16,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar17 = tcu::MessageBuilder::operator<<((MessageBuilder *)&y_2,(char (*) [6])"Pass ");
    pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(int *)&rnd.m_rnd.z);
    pMVar17 = tcu::MessageBuilder::operator<<
                        (pMVar17,(char (*) [34])": Drawing tiles with the shader.\n");
    pMVar17 = tcu::MessageBuilder::operator<<
                        (pMVar17,(char (*) [35])"\tVarying u_special for each tile.\n");
    pMVar17 = tcu::MessageBuilder::operator<<
                        (pMVar17,(char (*) [59])
                                 "\tVarying blend function and blend equation for each tile.\n");
    tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&y_2);
    for (blendEquation = 0; (int)blendEquation < 0x16; blendEquation = blendEquation + 1) {
      for (blendFunction = 0; (int)blendFunction < 0x12; blendFunction = blendFunction + 1) {
        GVar1 = testFBO::equations[(int)blendFunction % 3];
        GVar2 = testFBO::functions[(int)blendFunction / 3];
        uVar12 = de::Random::choose<unsigned_int,unsigned_int_const*>
                           ((Random *)local_2bc,testFBO::functions,(uint *)"special_float");
        x_ = de::Random::choose<unsigned_int,unsigned_int_const*>
                       ((Random *)local_2bc,(uint *)(anonymous_namespace)::s_specialFloats,
                        (uint *)"N4deqp5gles26Stress12_GLOBAL__N_111UniformCaseE");
        y_ = de::Random::choose<unsigned_int,unsigned_int_const*>
                       ((Random *)local_2bc,(uint *)(anonymous_namespace)::s_specialFloats,
                        (uint *)"N4deqp5gles26Stress12_GLOBAL__N_111UniformCaseE");
        uniformValue.m_data[3] =
             de::Random::choose<unsigned_int,unsigned_int_const*>
                       ((Random *)local_2bc,(uint *)(anonymous_namespace)::s_specialFloats,
                        (uint *)"N4deqp5gles26Stress12_GLOBAL__N_111UniformCaseE");
        uniformValue.m_data[2] =
             de::Random::choose<unsigned_int,unsigned_int_const*>
                       ((Random *)local_2bc,(uint *)(anonymous_namespace)::s_specialFloats,
                        (uint *)"N4deqp5gles26Stress12_GLOBAL__N_111UniformCaseE");
        tcu::Vector<unsigned_int,_4>::Vector
                  ((Vector<unsigned_int,_4> *)local_478,x_,y_,uniformValue.m_data[3],
                   uniformValue.m_data[2]);
        GVar7 = local_100;
        pcVar3 = *(code **)(_specialLoc + 0x15a8);
        puVar19 = tcu::Vector<unsigned_int,_4>::getPtr((Vector<unsigned_int,_4> *)local_478);
        (*pcVar3)(GVar7,1,puVar19);
        (**(code **)(_specialLoc + 0x100))(GVar1);
        (**(code **)(_specialLoc + 0x120))(GVar2,uVar12);
        pcVar3 = *(code **)(_specialLoc + 0x568);
        pvVar14 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                             &textureFormat.type,
                             (long)(int)((blendFunction + blendEquation * 0x12) * 6));
        (*pcVar3)(4,6,0x1403,pvVar14);
      }
    }
    de::Random::~Random((Random *)local_2bc);
  }
  dVar11 = (**(code **)(_specialLoc + 0x800))();
  glu::checkError(dVar11,"special passes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x640);
  pTVar16 = tcu::TestContext::getLog
                      ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.
                       super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_5f8,pTVar16,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar17 = tcu::MessageBuilder::operator<<(&local_5f8,(char (*) [27])"Drawing post-draw pattern.");
  tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_5f8);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&errorMask.m_pixels.m_cap,(TextureLevel *)&y);
  GVar7 = local_100;
  sVar18 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_30);
  drawTestImage(this,(PixelBufferAccess *)&errorMask.m_pixels.m_cap,GVar7,(int)sVar18 + -1);
  dVar11 = (**(code **)(_specialLoc + 0x800))();
  glu::checkError(dVar11,"post-draw pattern",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x645);
  (**(code **)(_specialLoc + 0x518))(local_fc);
  (**(code **)(_specialLoc + 0x1680))(0);
  dVar11 = (**(code **)(_specialLoc + 0x800))();
  glu::checkError(dVar11,"OutputCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x649);
  tcu::Surface::Surface((Surface *)&okPixelColor,0x100,0x100);
  badPixels = (int)tcu::RGBA::red();
  local_640 = tcu::RGBA::green();
  local_644 = 0;
  pTVar16 = tcu::TestContext::getLog
                      ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.
                       super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&x_3,pTVar16,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar17 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&x_3,(char (*) [33])"Checking patterns are identical.");
  tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x_3);
  cBefore.m_data[3] = 0.0;
  while( true ) {
    fVar6 = cBefore.m_data[3];
    iVar10 = tcu::TextureLevel::getHeight((TextureLevel *)&afterImage.m_data.m_cap);
    if (iVar10 <= (int)fVar6) break;
    cBefore.m_data[2] = 0.0;
    while( true ) {
      fVar6 = cBefore.m_data[2];
      iVar10 = tcu::TextureLevel::getWidth((TextureLevel *)&afterImage.m_data.m_cap);
      if (iVar10 <= (int)fVar6) break;
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)(cAfter.m_data + 2),(TextureLevel *)&afterImage.m_data.m_cap);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_7e0,(int)(cAfter.m_data + 2),(int)cBefore.m_data[2]
                 ,(int)cBefore.m_data[3]);
      tcu::TextureLevel::getAccess(&local_840,(TextureLevel *)&y);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_818,(int)&local_840,(int)cBefore.m_data[2],
                 (int)cBefore.m_data[3]);
      bVar9 = tcu::Vector<float,_4>::operator!=
                        ((Vector<float,_4> *)local_7e0,(Vector<float,_4> *)local_818);
      if (bVar9) {
        local_644 = local_644 + 1;
        local_844 = badPixels;
        tcu::Surface::setPixel
                  ((Surface *)&okPixelColor,(int)cBefore.m_data[2],(int)cBefore.m_data[3],
                   (RGBA)badPixels);
      }
      else {
        local_848 = local_640.m_value;
        tcu::Surface::setPixel
                  ((Surface *)&okPixelColor,(int)cBefore.m_data[2],(int)cBefore.m_data[3],local_640)
        ;
      }
      cBefore.m_data[2] = (float)((int)cBefore.m_data[2] + 1);
    }
    cBefore.m_data[3] = (float)((int)cBefore.m_data[3] + 1);
  }
  pTVar16 = tcu::TestContext::getLog
                      ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.
                       super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_9c8,pTVar16,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar17 = tcu::MessageBuilder::operator<<(&local_9c8,(char (*) [7])"Found ");
  pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,&local_644);
  pMVar17 = tcu::MessageBuilder::operator<<(pMVar17,(char (*) [19])" invalid pixel(s).");
  tcu::MessageBuilder::operator<<(pMVar17,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_9c8);
  if (local_644 == 0) {
    tcu::TestContext::setTestResult
              ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar16 = tcu::TestContext::getLog
                        ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.
                         super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a28,"Results",&local_a29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a50,"Result verification",&local_a51);
    tcu::LogImageSet::LogImageSet(&local_a08,&local_a28,&local_a50);
    pTVar16 = tcu::TestLog::operator<<(pTVar16,&local_a08);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b08,"Pattern drawn before special float blending",&local_b09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b30,"Pattern drawn before special float blending",&local_b31);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&local_b60,(TextureLevel *)&afterImage.m_data.m_cap);
    tcu::LogImage::LogImage
              (&local_ae8,&local_b08,&local_b30,&local_b60,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar16 = tcu::TestLog::operator<<(pTVar16,&local_ae8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c10,"Pattern drawn after special float blending",&local_c11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c38,"Pattern drawn after special float blending",&local_c39);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_c68,(TextureLevel *)&y);
    tcu::LogImage::LogImage
              (&local_bf0,&local_c10,&local_c38,&local_c68,QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar16 = tcu::TestLog::operator<<(pTVar16,&local_bf0);
    tcu::TestLog::operator<<(pTVar16,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_bf0);
    std::__cxx11::string::~string((string *)&local_c38);
    std::allocator<char>::~allocator(&local_c39);
    std::__cxx11::string::~string((string *)&local_c10);
    std::allocator<char>::~allocator(&local_c11);
    tcu::LogImage::~LogImage(&local_ae8);
    std::__cxx11::string::~string((string *)&local_b30);
    std::allocator<char>::~allocator(&local_b31);
    std::__cxx11::string::~string((string *)&local_b08);
    std::allocator<char>::~allocator(&local_b09);
    tcu::LogImageSet::~LogImageSet(&local_a08);
    std::__cxx11::string::~string((string *)&local_a50);
    std::allocator<char>::~allocator(&local_a51);
    std::__cxx11::string::~string((string *)&local_a28);
    std::allocator<char>::~allocator(&local_a29);
    tcu::TestContext::setTestResult
              ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Image comparison failed");
  }
  tcu::Surface::~Surface((Surface *)&okPixelColor);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&y);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&afterImage.m_data.m_cap);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&textureFormat.type);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30);
  return;
}

Assistant:

void BlendingCase::testFBO (void)
{
	static const GLenum equations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
	};
	static const GLenum functions[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
	};

	// Create a [BlendFuncs] X [s_specialFloats] grid of tiles. ( BlendFuncs = equations x functions )

	const int						numBlendFuncs	= DE_LENGTH_OF_ARRAY(equations) * DE_LENGTH_OF_ARRAY(functions);
	std::vector<tcu::Vec4>			gridVertices	((numBlendFuncs + 1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1));
	std::vector<deUint16>			indices			(numBlendFuncs * DE_LENGTH_OF_ARRAY(s_specialFloats) * 6);
	tcu::TextureFormat				textureFormat	(tcu::TextureFormat::RGBA, (m_fboType == FBO_RGBA_FLOAT16) ? (tcu::TextureFormat::FLOAT) : (tcu::TextureFormat::UNORM_INT8));
	tcu::TextureLevel				beforeImage		(textureFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::TextureLevel				afterImage		(textureFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++x)
	for (int y = 0; y < numBlendFuncs + 1; ++y)
	{
		const float		posX	= (float)x / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f; // map from [0, len(s_specialFloats)] to [-1, 1]
		const float		posY	= (float)y / (float)numBlendFuncs * 2.0f - 1.0f;

		gridVertices[x * (numBlendFuncs + 1) + y]	= tcu::Vec4(posX, posY, 0.0f, 1.0f);
	}

	// tiles
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
	for (int y = 0; y < numBlendFuncs; ++y)
	{
		const int baseNdx = (x * numBlendFuncs + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * (numBlendFuncs + 1) + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * (numBlendFuncs + 1) + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * (numBlendFuncs + 1) + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * (numBlendFuncs + 1) + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * (numBlendFuncs + 1) + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * (numBlendFuncs + 1) + (y+1));
	}

	// Draw tiles
	{
		const int				numPasses	= 5;
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				specialLoc	= gl.getUniformLocation(m_program->getProgram(), "u_special");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());
		gl.enable(GL_BLEND);
		GLU_EXPECT_NO_ERROR(gl.getError(), "pre-draw");

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.enableVertexAttribArray(positionLoc);

		// draw "before" image
		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing pre-draw pattern." << tcu::TestLog::EndMessage;
		drawTestImage(beforeImage.getAccess(), specialLoc, (int)gridVertices.size() - 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "pre-draw pattern");

		// draw multiple passes with special floats
		gl.clear(GL_COLOR_BUFFER_BIT);
		for (int passNdx = 0; passNdx < numPasses; ++passNdx)
		{
			de::Random rnd(123 + 567 * passNdx);

			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Pass " << passNdx << ": Drawing tiles with the shader.\n"
				<< "\tVarying u_special for each tile.\n"
				<< "\tVarying blend function and blend equation for each tile.\n"
				<< tcu::TestLog::EndMessage;

			// draw tiles
			for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
			for (int y = 0; y < numBlendFuncs; ++y)
			{
				const GLenum		blendEquation		= equations[y % DE_LENGTH_OF_ARRAY(equations)];
				const GLenum		blendFunction		= functions[y / DE_LENGTH_OF_ARRAY(equations)];
				const GLenum		blendFunctionDst	= rnd.choose<GLenum>(DE_ARRAY_BEGIN(functions), DE_ARRAY_END(functions));
				const int			indexIndex			= (x * numBlendFuncs + y) * 6;

				// "rnd.get"s are run in a deterministic order
				const deUint32		componentR			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				const deUint32		componentG			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				const deUint32		componentB			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				const deUint32		componentA			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				const tcu::UVec4	uniformValue		= tcu::UVec4(componentR, componentG, componentB, componentA);

				gl.uniform4fv(specialLoc, 1, (const float*)uniformValue.getPtr());
				gl.blendEquation(blendEquation);
				gl.blendFunc(blendFunction, blendFunctionDst);
				gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, &indices[indexIndex]);
			}
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "special passes");

		// draw "after" image
		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing post-draw pattern." << tcu::TestLog::EndMessage;
		drawTestImage(afterImage.getAccess(), specialLoc, (int)gridVertices.size() - 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "post-draw pattern");

		gl.disableVertexAttribArray(positionLoc);
		gl.useProgram(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "OutputCase::iterate");
	}

	// Check results
	{
		tcu::Surface		errorMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		const tcu::RGBA		badPixelColor	= tcu::RGBA::red();
		const tcu::RGBA		okPixelColor	= tcu::RGBA::green();
		int					badPixels		= 0;

		m_testCtx.getLog() << tcu::TestLog::Message << "Checking patterns are identical." << tcu::TestLog::EndMessage;

		for (int y = 0; y < beforeImage.getHeight(); ++y)
		for (int x = 0; x < beforeImage.getWidth(); ++x)
		{
			const tcu::Vec4	cBefore	= beforeImage.getAccess().getPixel(x, y);
			const tcu::Vec4	cAfter	= afterImage.getAccess().getPixel(x, y);

			if (cBefore != cAfter)
			{
				++badPixels;
				errorMask.setPixel(x, y, badPixelColor);
			}
			else
				errorMask.setPixel(x, y, okPixelColor);
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Found " << badPixels << " invalid pixel(s)." << tcu::TestLog::EndMessage;

		if (badPixels)
		{
			m_testCtx.getLog()
					<< tcu::TestLog::ImageSet("Results", "Result verification")
					<< tcu::TestLog::Image("Pattern drawn before special float blending",	"Pattern drawn before special float blending",		beforeImage)
					<< tcu::TestLog::Image("Pattern drawn after special float blending",	"Pattern drawn after special float blending",		afterImage)
					<< tcu::TestLog::EndImageSet;

			// all ok?
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
}